

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

void __thiscall
CommandLineArguments::AddExcludeStrictGroupFilter
          (CommandLineArguments *this,int ac,char **av,int *i)

{
  TestFilter *pTVar1;
  int ac_00;
  SimpleString SStack_38;
  
  pTVar1 = (TestFilter *)
           operator_new(0x18,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O2/cpputest-master/src/CppUTest/src/CppUTest/CommandLineArguments.cpp"
                        ,0xb7);
  ac_00 = 0x1ad9ba;
  SimpleString::SimpleString(&SStack_38,"-xsg");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffd0,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  TestFilter::TestFilter(pTVar1,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString(&SStack_38);
  TestFilter::strictMatching(pTVar1);
  TestFilter::invertMatching(pTVar1);
  pTVar1 = TestFilter::add(pTVar1,this->groupFilters_);
  this->groupFilters_ = pTVar1;
  return;
}

Assistant:

void CommandLineArguments::AddExcludeStrictGroupFilter(int ac, const char** av, int& i)
{
    TestFilter* groupFilter = new TestFilter(getParameterField(ac, av, i, "-xsg"));
    groupFilter->strictMatching();
    groupFilter->invertMatching();
    groupFilters_ = groupFilter->add(groupFilters_);
}